

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webvttparser.cc
# Opt level: O0

int __thiscall libwebvtt::Parser::Parse(Parser *this,Cue *cue)

{
  bool bVar1;
  ulong uVar2;
  payload_t *this_00;
  payload_t *p;
  size_type arrow_pos;
  undefined4 local_58;
  char kArrow [4];
  string local_40 [4];
  int e;
  string line;
  Cue *cue_local;
  Parser *this_local;
  
  if (cue == (Cue *)0x0) {
    return -1;
  }
  std::__cxx11::string::string(local_40);
  do {
    this_local._4_4_ = LineReader::GetLine(&this->super_LineReader,(string *)local_40);
    if (this_local._4_4_ != 0) goto LAB_00136863;
    uVar2 = std::__cxx11::string::empty();
  } while ((uVar2 & 1) != 0);
  arrow_pos._4_4_ = 0x3e2d2d;
  p = (payload_t *)std::__cxx11::string::find((char *)local_40,(long)&arrow_pos + 4);
  if (p == (payload_t *)0xffffffffffffffff) {
    std::__cxx11::string::swap((string *)cue);
    this_local._4_4_ = LineReader::GetLine(&this->super_LineReader,(string *)local_40);
    if (this_local._4_4_ < 0) goto LAB_00136863;
    if (0 < this_local._4_4_) {
      this_local._4_4_ = -1;
      goto LAB_00136863;
    }
    p = (payload_t *)std::__cxx11::string::find((char *)local_40,(long)&arrow_pos + 4);
    if (p == (payload_t *)0xffffffffffffffff) {
      this_local._4_4_ = -1;
      goto LAB_00136863;
    }
  }
  else {
    std::__cxx11::string::clear();
  }
  this_local._4_4_ =
       ParseTimingsLine((string *)local_40,(size_type)p,&cue->start_time,&cue->stop_time,
                        &cue->settings);
  if (this_local._4_4_ == 0) {
    this_00 = &cue->payload;
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(this_00);
    while (this_local._4_4_ = LineReader::GetLine(&this->super_LineReader,(string *)local_40),
          -1 < this_local._4_4_) {
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) != 0) {
        bVar1 = std::__cxx11::
                list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty(this_00);
        if (bVar1) {
          this_local._4_4_ = -1;
        }
        else {
          this_local._4_4_ = 0;
        }
        break;
      }
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(this_00,(value_type *)local_40);
    }
  }
LAB_00136863:
  local_58 = 1;
  std::__cxx11::string::~string(local_40);
  return this_local._4_4_;
}

Assistant:

int Parser::Parse(Cue* cue) {
  if (cue == NULL)
    return -1;

  // Parse first non-blank line

  std::string line;
  int e;

  for (;;) {
    e = GetLine(&line);

    if (e)  // EOF is OK here
      return e;

    if (!line.empty())
      break;
  }

  // A WebVTT cue comprises an optional cue identifier line followed
  // by a (non-optional) timings line.  You determine whether you have
  // a timings line by scanning for the arrow token, the lexeme of which
  // may not appear in the cue identifier line.

  const char kArrow[] = "-->";
  std::string::size_type arrow_pos = line.find(kArrow);

  if (arrow_pos != std::string::npos) {
    // We found a timings line, which implies that we don't have a cue
    // identifier.

    cue->identifier.clear();
  } else {
    // We did not find a timings line, so we assume that we have a cue
    // identifier line, and then try again to find the cue timings on
    // the next line.

    cue->identifier.swap(line);

    e = GetLine(&line);

    if (e < 0)  // error
      return e;

    if (e > 0)  // EOF
      return -1;

    arrow_pos = line.find(kArrow);

    if (arrow_pos == std::string::npos)  // not a timings line
      return -1;
  }

  e = ParseTimingsLine(&line, arrow_pos, &cue->start_time, &cue->stop_time,
                       &cue->settings);

  if (e)  // error
    return e;

  // The cue payload comprises all the non-empty
  // lines that follow the timings line.

  Cue::payload_t& p = cue->payload;
  p.clear();

  for (;;) {
    e = GetLine(&line);

    if (e < 0)  // error
      return e;

    if (line.empty())
      break;

    p.push_back(line);
  }

  if (p.empty())
    return -1;

  return 0;  // success
}